

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * __thiscall
tcu::Format::Enum<vk::VkPrimitiveTopology,_4UL>::toStream
          (Enum<vk::VkPrimitiveTopology,_4UL> *this,ostream *stream)

{
  char *pcVar1;
  ostream *poVar2;
  Hex<8UL> hex;
  
  pcVar1 = (*this->m_getName)(this->m_value);
  if (pcVar1 != (char *)0x0) {
    poVar2 = std::operator<<(stream,pcVar1);
    return poVar2;
  }
  hex.value._4_4_ = 0;
  hex.value._0_4_ = this->m_value;
  poVar2 = Format::operator<<(stream,hex);
  return poVar2;
}

Assistant:

std::ostream& toStream (std::ostream& stream) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return stream << name;
		else
			return stream << Hex<NumBytes*2>((deUint64)m_value);
	}